

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::find_impl<cs_impl::any>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           *this,key_arg<cs_impl::any> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  ulong uVar2;
  proxy *ppVar3;
  proxy *ppVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  byte unaff_BL;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i match;
  long local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar26 = hashval >> 7 & uVar2;
  auVar30 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar30 = pshuflw(auVar30,auVar30,0);
  local_60 = 0;
  do {
    pcVar1 = this->ctrl_ + uVar26;
    cVar7 = *pcVar1;
    cVar8 = pcVar1[1];
    cVar9 = pcVar1[2];
    cVar10 = pcVar1[3];
    cVar11 = pcVar1[4];
    cVar12 = pcVar1[5];
    cVar13 = pcVar1[6];
    cVar14 = pcVar1[7];
    cVar15 = pcVar1[8];
    cVar16 = pcVar1[9];
    cVar17 = pcVar1[10];
    cVar18 = pcVar1[0xb];
    cVar19 = pcVar1[0xc];
    cVar20 = pcVar1[0xd];
    cVar21 = pcVar1[0xe];
    cVar22 = pcVar1[0xf];
    local_58 = auVar30[0];
    cStack_57 = auVar30[1];
    cStack_56 = auVar30[2];
    cStack_55 = auVar30[3];
    auVar31[0] = -(local_58 == cVar7);
    auVar31[1] = -(cStack_57 == cVar8);
    auVar31[2] = -(cStack_56 == cVar9);
    auVar31[3] = -(cStack_55 == cVar10);
    auVar31[4] = -(local_58 == cVar11);
    auVar31[5] = -(cStack_57 == cVar12);
    auVar31[6] = -(cStack_56 == cVar13);
    auVar31[7] = -(cStack_55 == cVar14);
    auVar31[8] = -(local_58 == cVar15);
    auVar31[9] = -(cStack_57 == cVar16);
    auVar31[10] = -(cStack_56 == cVar17);
    auVar31[0xb] = -(cStack_55 == cVar18);
    auVar31[0xc] = -(local_58 == cVar19);
    auVar31[0xd] = -(cStack_57 == cVar20);
    auVar31[0xe] = -(cStack_56 == cVar21);
    auVar31[0xf] = -(cStack_55 == cVar22);
    uVar6 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
    bVar28 = uVar6 == 0;
    if (!bVar28) {
      uVar24 = (uint)uVar6;
      do {
        uVar5 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar25 = uVar5 + uVar26 & uVar2;
        *offset = uVar25;
        ppVar3 = this->slots_[uVar25].value.first.mDat;
        ppVar4 = key->mDat;
        bVar29 = ppVar3 == (proxy *)0x0 && ppVar4 == (proxy *)0x0;
        if (ppVar4 != (proxy *)0x0 && ppVar3 != (proxy *)0x0) {
          iVar23 = (*ppVar3->data->_vptr_baseHolder[4])(ppVar3->data,ppVar4->data);
          bVar29 = (byte)iVar23;
        }
        unaff_BL = unaff_BL | bVar29;
        if (bVar29 != 0) break;
        uVar24 = uVar24 - 1 & uVar24;
        bVar28 = uVar24 == 0;
      } while (!bVar28);
    }
    if (bVar28) {
      auVar32[0] = -(cVar7 == -0x80);
      auVar32[1] = -(cVar8 == -0x80);
      auVar32[2] = -(cVar9 == -0x80);
      auVar32[3] = -(cVar10 == -0x80);
      auVar32[4] = -(cVar11 == -0x80);
      auVar32[5] = -(cVar12 == -0x80);
      auVar32[6] = -(cVar13 == -0x80);
      auVar32[7] = -(cVar14 == -0x80);
      auVar32[8] = -(cVar15 == -0x80);
      auVar32[9] = -(cVar16 == -0x80);
      auVar32[10] = -(cVar17 == -0x80);
      auVar32[0xb] = -(cVar18 == -0x80);
      auVar32[0xc] = -(cVar19 == -0x80);
      auVar32[0xd] = -(cVar20 == -0x80);
      auVar32[0xe] = -(cVar21 == -0x80);
      auVar32[0xf] = -(cVar22 == -0x80);
      if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar32 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar32 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar32 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar32 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar32 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar32 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
      {
        lVar27 = uVar26 + local_60;
        local_60 = local_60 + 0x10;
        uVar26 = lVar27 + 0x10U & uVar2;
        bVar28 = true;
      }
      else {
        bVar28 = false;
        unaff_BL = 0;
      }
    }
    else {
      bVar28 = false;
    }
    if (!bVar28) {
      return (bool)(unaff_BL & 1);
    }
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const
			{
				return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
			}